

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Room.cpp
# Opt level: O0

vector<int,_std::allocator<int>_> * __thiscall
Room::GetPlayers(vector<int,_std::allocator<int>_> *__return_storage_ptr__,Room *this)

{
  bool bVar1;
  reference __x;
  pair<const_int,_std::shared_ptr<Player>_> *it;
  iterator __end1;
  iterator __begin1;
  map<int,_std::shared_ptr<Player>,_std::less<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<Player>_>_>_>
  *__range1;
  Room *this_local;
  vector<int,_std::allocator<int>_> *output;
  
  std::vector<int,_std::allocator<int>_>::vector(__return_storage_ptr__);
  __end1 = std::
           map<int,_std::shared_ptr<Player>,_std::less<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<Player>_>_>_>
           ::begin(&this->m_player_map);
  it = (pair<const_int,_std::shared_ptr<Player>_> *)
       std::
       map<int,_std::shared_ptr<Player>,_std::less<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<Player>_>_>_>
       ::end(&this->m_player_map);
  while (bVar1 = std::operator!=(&__end1,(_Self *)&it), bVar1) {
    __x = std::_Rb_tree_iterator<std::pair<const_int,_std::shared_ptr<Player>_>_>::operator*
                    (&__end1);
    std::vector<int,_std::allocator<int>_>::push_back(__return_storage_ptr__,&__x->first);
    std::_Rb_tree_iterator<std::pair<const_int,_std::shared_ptr<Player>_>_>::operator++(&__end1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<int> Room::GetPlayers() {
    std::vector<int> output;
    for (auto & it : m_player_map) {
        output.push_back(it.first);
    }
    return output;
}